

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyWithAttributes
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  int *piVar1;
  bool bVar2;
  PropertyIndex index;
  int iVar3;
  BOOL BVar4;
  DynamicTypeHandler *pDVar5;
  
  if (attributes < 0x10) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ShareTypesWithAttributesPhase);
    if (!bVar2) {
      index = TypePath::LookupInline
                        ((this->typePath).ptr,propertyId,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      BVar4 = SetPropertyInternal<true>
                        (this,instance,propertyId,index,value,attributes,info,flags,
                         possibleSideEffects,false);
      return BVar4;
    }
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertPathToDictionaryAttributesCount
  ;
  *piVar1 = *piVar1 + 1;
  pDVar5 = TryConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     (this,instance,((this->super_DynamicTypeHandler).unusedBytes >> 1) + 1,false);
  iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x3a])
                    (pDVar5,instance,(ulong)(uint)propertyId,value,(ulong)attributes,info);
  return iVar3;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (!ObjectSlotAttributesContains(attributes) || PHASE_OFF1(ShareTypesWithAttributesPhase))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif

            return TryConvertToSimpleDictionaryType(instance, GetPathLength() + 1)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
        }

        PropertyIndex index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        return PathTypeHandlerBase::SetPropertyInternal<true>(instance, propertyId, index, value, PropertyAttributesToObjectSlotAttributes(attributes), info, flags, possibleSideEffects);
    }